

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedMeshControl::HybridizeSkeleton
          (TPZMHMixedMeshControl *this,int skeletonmatid,int pressurematid)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  iterator lineN;
  TPZCompMesh *pTVar4;
  pointer ppVar5;
  TPZCompEl *pTVar6;
  size_type sVar7;
  reference celside;
  TPZConnect *this_00;
  TPZDepend *pTVar8;
  int64_t iVar9;
  TPZGeoEl *pTVar10;
  int64_t referenceindex;
  int64_t referenceindex_00;
  TPZInterpolatedElement **ppTVar11;
  int in_ESI;
  long in_RDI;
  int64_t pressuregelindex;
  int pressmat;
  int fluxmat;
  int64_t fluxgelindex;
  int iflux;
  int64_t numflux;
  TPZDepend *dep;
  TPZConnect *c_1;
  TPZInterpolatedElement *smallel;
  TPZCompElSide smallCompElSide;
  iterator itlist;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *updatelist;
  int64_t newdepindex;
  int64_t origdepindex;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  connectedmap;
  TPZCompEl *cel;
  TPZGeoEl *gel_2;
  int64_t count;
  TPZConnect *c;
  int ic;
  int nc;
  TPZInterpolatedElement *presel;
  TPZCompEl *celpressure;
  TPZGeoElBC pressuregel;
  TPZInterpolatedElement *intel;
  TPZCompEl *celflux;
  TPZGeoElBC skeleton2;
  TPZGeoElSide gelside;
  int side_1;
  TPZGeoEl *gel_1;
  TPZInterpolatedElement *orig;
  int side;
  TPZGeoEl *gel;
  TPZStack<TPZInterpolatedElement_*,_10> pressure;
  TPZStack<TPZInterpolatedElement_*,_10> fluxsecond;
  TPZStack<TPZInterpolatedElement_*,_10> fluxorig;
  iterator it;
  int64_t nskel;
  TPZGeoEl *in_stack_fffffffffffffa58;
  TPZCompMesh *in_stack_fffffffffffffa60;
  TPZGeoEl *in_stack_fffffffffffffa68;
  TPZCompMesh *in_stack_fffffffffffffa70;
  TPZGeoElSide *in_stack_fffffffffffffa78;
  TPZGeoElBC *in_stack_fffffffffffffa80;
  TPZInterpolatedElement *in_stack_fffffffffffffa88;
  int64_t in_stack_fffffffffffffa90;
  TPZCompEl *in_stack_fffffffffffffa98;
  TPZMHMeshControl *in_stack_fffffffffffffaa0;
  long *local_498;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  *ellist;
  pair<long,_long> *leftright;
  TPZCompEl *in_stack_fffffffffffffbb8;
  TPZMHMeshControl *in_stack_fffffffffffffbc0;
  long *local_3f0;
  long *local_3b0;
  undefined8 local_350;
  int local_2f4;
  TPZCompElSide local_2c0;
  _Self local_2b0;
  _Self local_2a8;
  mapped_type *local_2a0;
  int64_t local_298;
  long local_290;
  pair<long,_long> local_288 [3];
  TPZCompEl *local_258;
  TPZGeoEl *local_250;
  _Self local_248;
  _Base_ptr local_240;
  long local_238;
  _Base_ptr local_230;
  TPZConnect *local_228;
  int local_220;
  int local_21c;
  long *local_218;
  TPZCompEl *local_210;
  TPZGeoElBC local_208;
  long *local_200;
  TPZCompEl *local_1f8;
  TPZGeoElBC local_1f0 [4];
  int local_1cc;
  TPZGeoEl *local_1c8;
  _Self local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  undefined8 local_1a8;
  int local_19c;
  TPZGeoEl *local_198;
  _Self local_190;
  _func_int **in_stack_fffffffffffffe80;
  TPZVec<TPZInterpolatedElement_*> local_100 [3];
  TPZVec<TPZInterpolatedElement_*> local_90 [3];
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> local_20;
  size_type local_18;
  int local_c;
  
  local_c = in_ESI;
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffa70);
  local_18 = std::
             map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
             ::size((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                     *)0x1f61692);
  std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::_Rb_tree_iterator
            (&local_20);
  TPZStack<TPZInterpolatedElement_*,_10>::TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70);
  TPZStack<TPZInterpolatedElement_*,_10>::TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70);
  TPZStack<TPZInterpolatedElement_*,_10>::TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffa70);
  lineN = std::
          map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
          ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                   *)in_stack_fffffffffffffa58);
  local_20._M_node = lineN._M_node;
  while( true ) {
    local_190._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffa58);
    bVar2 = std::operator!=(&local_20,&local_190);
    if (!bVar2) break;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f6178d);
    local_198 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffa60,
                                    (int64_t)in_stack_fffffffffffffa58);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f617c4);
    lVar1 = ppVar5->first;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f617dc);
    if ((lVar1 != (ppVar5->second).second) &&
       (iVar3 = TPZGeoEl::MaterialId(local_198), iVar3 == local_c)) {
      local_19c = (**(code **)(*(long *)local_198 + 0xf0))();
      local_19c = local_19c + -1;
      pTVar6 = TPZGeoEl::Reference(local_198);
      if (pTVar6 == (TPZCompEl *)0x0) {
        local_350 = 0;
      }
      else {
        local_350 = __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      local_1a8 = local_350;
      TPZStack<TPZInterpolatedElement_*,_10>::Push
                ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70,
                 (TPZInterpolatedElement *)in_stack_fffffffffffffa68);
    }
    local_1b0 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                           in_stack_fffffffffffffa68,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20)
                          );
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffa70);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  TPZCompMesh::SetDefaultOrder(pTVar4,*(int *)(in_RDI + 0xb4));
  local_1b8 = (_Base_ptr)
              std::
              map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
              ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                       *)in_stack_fffffffffffffa58);
  local_20._M_node = local_1b8;
  while( true ) {
    local_1c0._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffa58);
    bVar2 = std::operator!=(&local_20,&local_1c0);
    if (!bVar2) break;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f61a24);
    local_1c8 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffa60,
                                    (int64_t)in_stack_fffffffffffffa58);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f61a5b);
    lVar1 = ppVar5->first;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f61a73);
    if ((lVar1 != (ppVar5->second).second) &&
       (iVar3 = TPZGeoEl::MaterialId(local_1c8), iVar3 == local_c)) {
      local_1cc = (**(code **)(*(long *)local_1c8 + 0xf0))();
      local_1cc = local_1cc + -1;
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
      TPZGeoElBC::TPZGeoElBC
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (int)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
      TPZCompMesh::SetAllCreateFunctionsHDiv(in_stack_fffffffffffffa60);
      TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
      TPZGeoElBC::CreatedElement(local_1f0);
      local_1f8 = TPZCompMesh::CreateCompEl(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      if (local_1f8 == (TPZCompEl *)0x0) {
        local_3b0 = (long *)0x0;
      }
      else {
        local_3b0 = (long *)__dynamic_cast(local_1f8,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0);
      }
      local_200 = local_3b0;
      TPZMHMeshControl::SetSubdomain
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          0x1f61c5e);
      lVar1 = (ppVar5->second).first;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          0x1f61c77);
      if (lVar1 < (ppVar5->second).second) {
        (**(code **)(*local_200 + 0x2f8))(local_200,local_1cc,1);
      }
      else {
        (**(code **)(*local_200 + 0x2f8))(local_200,local_1cc,1);
      }
      pTVar10 = TPZGeoElBC::CreatedElement(local_1f0);
      TPZGeoEl::ResetReference(pTVar10);
      TPZGeoElBC::TPZGeoElBC
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (int)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
      TPZCompMesh::SetAllCreateFunctionsContinuous((TPZCompMesh *)0x1f61d3c);
      TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
      TPZGeoElBC::CreatedElement(&local_208);
      local_210 = TPZCompMesh::CreateCompEl(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      if (local_210 == (TPZCompEl *)0x0) {
        local_3f0 = (long *)0x0;
      }
      else {
        local_3f0 = (long *)__dynamic_cast(local_210,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0);
      }
      local_218 = local_3f0;
      TPZMHMeshControl::SetSubdomain
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      local_21c = (**(code **)(*local_218 + 0x90))();
      for (local_220 = 0; local_220 < local_21c; local_220 = local_220 + 1) {
        local_228 = (TPZConnect *)(**(code **)(*local_218 + 0xa8))(local_218,local_220);
        TPZConnect::SetLagrangeMultiplier(local_228,'\x03');
      }
      pTVar10 = TPZGeoElBC::CreatedElement(&local_208);
      TPZGeoEl::ResetReference(pTVar10);
      TPZStack<TPZInterpolatedElement_*,_10>::Push
                ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70,
                 (TPZInterpolatedElement *)in_stack_fffffffffffffa68);
      TPZStack<TPZInterpolatedElement_*,_10>::Push
                ((TPZStack<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffa70,
                 (TPZInterpolatedElement *)in_stack_fffffffffffffa68);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f61f1d);
    }
    local_230 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                           in_stack_fffffffffffffa68,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20)
                          );
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffa70);
  local_238 = 0;
  local_240 = (_Base_ptr)
              std::
              map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
              ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                       *)in_stack_fffffffffffffa58);
  local_20._M_node = local_240;
  while( true ) {
    local_248._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffa58);
    bVar2 = std::operator!=(&local_20,&local_248);
    if (!bVar2) break;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f62000);
    local_250 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffa60,
                                    (int64_t)in_stack_fffffffffffffa58);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f62037);
    lVar1 = ppVar5->first;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f6204f);
    if ((lVar1 != (ppVar5->second).second) &&
       (iVar3 = TPZGeoEl::MaterialId(local_250), iVar3 == local_c)) {
      pTVar6 = TPZGeoEl::Reference(local_250);
      local_258 = pTVar6;
      if ((pTVar6 == (TPZCompEl *)0x0) ||
         (in_stack_fffffffffffffbc0 =
               (TPZMHMeshControl *)TPZVec<TPZInterpolatedElement_*>::operator[](local_90,local_238),
         in_stack_fffffffffffffbb8 = pTVar6,
         pTVar6 != (TPZCompEl *)in_stack_fffffffffffffbc0->_vptr_TPZMHMeshControl)) {
        pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe80,(size_t)lineN._M_node);
      }
      leftright = local_288;
      std::
      map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
      ::map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
             *)0x1f62130);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          0x1f62145);
      ellist = (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)ppVar5->first;
      std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f6215d);
      TPZMHMeshControl::ConnectedElements
                (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,leftright,ellist);
      sVar7 = std::
              map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
              ::size((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                      *)0x1f62190);
      if (sVar7 != 2) {
        pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe80,(size_t)lineN._M_node);
      }
      ppTVar11 = TPZVec<TPZInterpolatedElement_*>::operator[](local_90,local_238);
      local_290 = (**(code **)(*(long *)&((*ppTVar11)->super_TPZInterpolationSpace).super_TPZCompEl
                              + 0xa0))(*ppTVar11,0);
      ppTVar11 = TPZVec<TPZInterpolatedElement_*>::operator[](local_100,local_238);
      local_298 = (**(code **)(*(long *)&((*ppTVar11)->super_TPZInterpolationSpace).super_TPZCompEl
                              + 0xa0))(*ppTVar11,0);
      std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f62282);
      local_2a0 = std::
                  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                  ::operator[]((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                                *)in_stack_fffffffffffffaa0,
                               (key_type_conflict1 *)in_stack_fffffffffffffa98);
      local_2a8._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::begin
                     ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                      in_stack_fffffffffffffa58);
      while( true ) {
        local_2b0._M_node =
             (_List_node_base *)
             std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::end
                       ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                        in_stack_fffffffffffffa58);
        bVar2 = std::operator!=(&local_2a8,&local_2b0);
        if (!bVar2) break;
        celside = std::_List_iterator<TPZCompElSide>::operator*
                            ((_List_iterator<TPZCompElSide> *)0x1f62305);
        TPZCompElSide::TPZCompElSide(&local_2c0,celside);
        pTVar6 = TPZCompElSide::Element(&local_2c0);
        if (pTVar6 == (TPZCompEl *)0x0) {
          local_498 = (long *)0x0;
        }
        else {
          local_498 = (long *)__dynamic_cast(pTVar6,&TPZCompEl::typeinfo,
                                             &TPZInterpolatedElement::typeinfo,0);
        }
        iVar3 = TPZCompElSide::Side(&local_2c0);
        iVar3 = (**(code **)(*local_498 + 0x248))(local_498,iVar3);
        if (iVar3 != 1) {
          pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe80,(size_t)lineN._M_node);
        }
        TPZCompElSide::Side(&local_2c0);
        this_00 = TPZInterpolatedElement::SideConnect
                            (in_stack_fffffffffffffa88,
                             (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),
                             (int)in_stack_fffffffffffffa80);
        pTVar8 = TPZConnect::FirstDepend(this_00);
        if (pTVar8->fDepConnectIndex != local_290) {
          pzinternal::DebugStopImpl((char *)in_stack_fffffffffffffe80,(size_t)lineN._M_node);
        }
        pTVar8->fDepConnectIndex = local_298;
        iVar3 = TPZCompElSide::Side(&local_2c0);
        (**(code **)(*local_498 + 0x2f8))(local_498,iVar3,1);
        std::_List_iterator<TPZCompElSide>::operator++(&local_2a8,0);
      }
      TPZVec<TPZInterpolatedElement_*>::operator[](local_90,local_238);
      std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f6254d);
      TPZMHMeshControl::SetSubdomain
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      TPZVec<TPZInterpolatedElement_*>::operator[](local_100,local_238);
      std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f625a7);
      TPZMHMeshControl::SetSubdomain
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      local_238 = local_238 + 1;
      std::
      map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
      ::~map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
              *)0x1f625e3);
    }
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
               in_stack_fffffffffffffa68,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffa70);
  iVar9 = TPZVec<TPZInterpolatedElement_*>::size(local_90);
  for (local_2f4 = 0; local_2f4 < iVar9; local_2f4 = local_2f4 + 1) {
    TPZVec<TPZInterpolatedElement_*>::operator[](local_90,(long)local_2f4);
    pTVar10 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    referenceindex = TPZGeoEl::Index(pTVar10);
    TPZVec<TPZInterpolatedElement_*>::operator[](local_90,(long)local_2f4);
    pTVar10 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    TPZGeoEl::MaterialId(pTVar10);
    TPZVec<TPZInterpolatedElement_*>::operator[]
              ((TPZVec<TPZInterpolatedElement_*> *)&stack0xfffffffffffffe80,(long)local_2f4);
    pTVar10 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    TPZGeoEl::MaterialId(pTVar10);
    TPZVec<TPZInterpolatedElement_*>::operator[]
              ((TPZVec<TPZInterpolatedElement_*> *)&stack0xfffffffffffffe80,(long)local_2f4);
    pTVar10 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    referenceindex_00 = TPZGeoEl::Index(pTVar10);
    ppTVar11 = TPZVec<TPZInterpolatedElement_*>::operator[](local_90,(long)local_2f4);
    TPZCompEl::SetReference((TPZCompEl *)*ppTVar11,referenceindex_00);
    ppTVar11 = TPZVec<TPZInterpolatedElement_*>::operator[]
                         ((TPZVec<TPZInterpolatedElement_*> *)&stack0xfffffffffffffe80,
                          (long)local_2f4);
    TPZCompEl::SetReference((TPZCompEl *)*ppTVar11,referenceindex);
    TPZVec<TPZInterpolatedElement_*>::operator[](local_90,(long)local_2f4);
    TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    SetAllMatid((TPZGeoEl *)in_stack_fffffffffffffa60,
                (int)((ulong)in_stack_fffffffffffffa58 >> 0x20));
    TPZVec<TPZInterpolatedElement_*>::operator[]
              ((TPZVec<TPZInterpolatedElement_*> *)&stack0xfffffffffffffe80,(long)local_2f4);
    in_stack_fffffffffffffa68 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffa68);
    SetAllMatid((TPZGeoEl *)in_stack_fffffffffffffa60,
                (int)((ulong)in_stack_fffffffffffffa58 >> 0x20));
  }
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  (**(code **)(*(long *)pTVar4 + 0x60))();
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  (**(code **)(*(long *)pTVar4 + 0x60))();
  TPZStack<TPZInterpolatedElement_*,_10>::~TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)0x1f6291d);
  TPZStack<TPZInterpolatedElement_*,_10>::~TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)0x1f6292a);
  TPZStack<TPZInterpolatedElement_*,_10>::~TPZStack
            ((TPZStack<TPZInterpolatedElement_*,_10> *)0x1f62937);
  return;
}

Assistant:

void TPZMHMixedMeshControl::HybridizeSkeleton(int skeletonmatid, int pressurematid)
{

    fGMesh->ResetReference();
    int64_t nskel = fInterfaces.size();
    std::map<int64_t, std::pair<int64_t, int64_t> >::iterator it;
    TPZStack<TPZInterpolatedElement*> fluxorig;
    TPZStack<TPZInterpolatedElement *> fluxsecond;
    TPZStack<TPZInterpolatedElement *> pressure;

    fFluxMesh->LoadReferences();
    // build the fluxorig datastructure : contains the original flux elements
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZInterpolatedElement *orig = dynamic_cast<TPZInterpolatedElement *>(gel->Reference());
        fluxorig.Push(orig);
    }
    fGMesh->ResetReference();
    
    fPressureFineMesh->SetDefaultOrder(fpOrderSkeleton);
    // first create a second flux element and a pressure element on top of the existing skeleton element
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZGeoElSide gelside(gel,side);
        TPZGeoElBC skeleton2(gelside,fSecondSkeletonMatId);
        fFluxMesh->SetAllCreateFunctionsHDiv();
        // create a flux boundary element
        TPZCompEl* celflux = fFluxMesh->CreateCompEl(skeleton2.CreatedElement());
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(celflux);
        SetSubdomain(intel, -1);
#ifdef PZDEBUG
        if (intel->NConnects() != 1) {
            DebugStop();
        }
#endif
        // the side orientation of the boundary fluxes is +1 - we will need to fix the elements as well!
        if (it->second.first < it->second.second) {
            // totototo
            intel->SetSideOrient(side, 1);
        }
        else
        {
            intel->SetSideOrient(side, 1);
        }
        skeleton2.CreatedElement()->ResetReference();
        
        // create a dim-1 dimensional pressure element
        TPZGeoElBC pressuregel(gelside,pressurematid);
        // this will be changed to the pressure mesh
//        fFluxMesh->SetAllCreateFunctionsContinuous();
        fPressureFineMesh->SetAllCreateFunctionsContinuous();
//        fFluxMesh->CreateCompEl(pressuregel.CreatedElement(), indexpressure);
        TPZCompEl* celpressure = fPressureFineMesh->CreateCompEl(pressuregel.CreatedElement());
        TPZInterpolatedElement *presel = dynamic_cast<TPZInterpolatedElement *>(celpressure);
        SetSubdomain(presel, -1);
        // set the lagrange multiplier to the highest level
        int nc = presel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            TPZConnect &c = presel->Connect(ic);
            c.SetLagrangeMultiplier(3);
        }
        // This can only be done after all flux connects have been created!!!
//        SetSubdomain(presel, -1);
        pressuregel.CreatedElement()->ResetReference();
        fluxsecond.Push(intel);
        pressure.Push(presel);
    }
    fFluxMesh->LoadReferences();
    
    // switch the connect dependency around AND fix the side orientation
    int64_t count = 0;
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        TPZCompEl *cel = gel->Reference();
        if (!cel || cel != fluxorig[count]) {
            DebugStop();
        }
        std::map<int64_t,std::list<TPZCompElSide> > connectedmap;
        // connected elements will compute all the subelements of the skeleton element to left and right
        ConnectedElements(it->first, it->second, connectedmap);
        if (connectedmap.size() != 2) {
            DebugStop();
        }
        // identify the domains left and right of the skeleton element
        int64_t origdepindex = fluxorig[count]->ConnectIndex(0);
        int64_t newdepindex = fluxsecond[count]->ConnectIndex(0);
        std::list<TPZCompElSide> &updatelist = connectedmap[it->second.second];
        for (std::list<TPZCompElSide>::iterator itlist = updatelist.begin(); itlist != updatelist.end(); itlist++)
        {
            TPZCompElSide smallCompElSide = *itlist;
            TPZInterpolatedElement *smallel = dynamic_cast<TPZInterpolatedElement *>(smallCompElSide.Element());
            if (smallel->NSideConnects(smallCompElSide.Side()) != 1) {
                DebugStop();
            }
            TPZConnect &c = smallel->SideConnect(0, smallCompElSide.Side());
            TPZConnect::TPZDepend *dep = c.FirstDepend();
            if(dep->fDepConnectIndex != origdepindex)
            {
                DebugStop();
            }
            dep->fDepConnectIndex = newdepindex;
            // Set the side orientation to +1
            smallel->SetSideOrient(smallCompElSide.Side(), 1);
        }
        SetSubdomain(fluxorig[count],it->second.first);
        SetSubdomain(fluxsecond[count], it->second.second);
        count++;
    }
    fGMesh->ResetReference();
    // switch the reference index of the original flux element and the pressure element
    int64_t numflux = fluxorig.size();
    for (int iflux=0; iflux<numflux; iflux++) {
        int64_t fluxgelindex = fluxorig[iflux]->Reference()->Index();
        int fluxmat = fluxorig[iflux]->Reference()->MaterialId();
        int pressmat = pressure[iflux]->Reference()->MaterialId();
        int64_t pressuregelindex = pressure[iflux]->Reference()->Index();
        fluxorig[iflux]->SetReference(pressuregelindex);
        pressure[iflux]->SetReference(fluxgelindex);
        SetAllMatid(fluxorig[iflux]->Reference(), fluxmat);
        SetAllMatid(pressure[iflux]->Reference(), pressmat);
    }

    // The connects of the pressure mesh are not to be condensed
    fFluxMesh->ExpandSolution();
    fPressureFineMesh->ExpandSolution();

}